

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamping.c
# Opt level: O3

timestamp_info * pop_pending_tx_timestamps(pending_tx_timestamps *tx_timestamps)

{
  uint uVar1;
  uint uVar2;
  timestamp_info *ptVar3;
  
  uVar1 = tx_timestamps->consumed;
  if (uVar1 <= tx_timestamps->head) {
    if (uVar1 < tx_timestamps->tail) {
      ptVar3 = tx_timestamps->pending;
      tx_timestamps->consumed = uVar1 + 1;
      uVar2 = get_max_pending_reqs();
      ptVar3 = ptVar3 + (ulong)uVar1 % (ulong)uVar2;
    }
    else {
      ptVar3 = (timestamp_info *)0x0;
    }
    return ptVar3;
  }
  __assert_fail("tx_timestamps->consumed <= tx_timestamps->head",
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/timestamping.c"
                ,0x12a,
                "struct timestamp_info *pop_pending_tx_timestamps(struct pending_tx_timestamps *)");
}

Assistant:

struct timestamp_info *
pop_pending_tx_timestamps(struct pending_tx_timestamps *tx_timestamps)
{
	struct timestamp_info *ret = NULL;

	assert(tx_timestamps->consumed <= tx_timestamps->head);
	if (tx_timestamps->consumed < tx_timestamps->tail)
		ret =
			&tx_timestamps
				 ->pending[tx_timestamps->consumed++ % get_max_pending_reqs()];

	return ret;
}